

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

uint32 rw::geoStructSize(Geometry *geo)

{
  MorphTarget *m;
  int local_18;
  int32 i_1;
  int32 i;
  uint32 size;
  Geometry *geo_local;
  
  i_1 = 0x10;
  if (version < 0x34000) {
    i_1 = 0x1c;
  }
  if ((geo->flags & 0x1000000) == 0) {
    if ((geo->flags & 8) != 0) {
      i_1 = geo->numVertices * 4 + i_1;
    }
    for (local_18 = 0; local_18 < geo->numTexCoordSets; local_18 = local_18 + 1) {
      i_1 = geo->numVertices * 8 + i_1;
    }
    i_1 = geo->numTriangles * 8 + i_1;
  }
  for (m._4_4_ = 0; m._4_4_ < geo->numMorphTargets; m._4_4_ = m._4_4_ + 1) {
    i_1 = i_1 + 0x18;
    if ((geo->flags & 0x1000000) == 0) {
      if (geo->morphTargets[m._4_4_].vertices != (V3d *)0x0) {
        i_1 = geo->numVertices * 0xc + i_1;
      }
      if (geo->morphTargets[m._4_4_].normals != (V3d *)0x0) {
        i_1 = geo->numVertices * 0xc + i_1;
      }
    }
  }
  return i_1;
}

Assistant:

static uint32
geoStructSize(Geometry *geo)
{
	uint32 size = 0;
	size += sizeof(GeoStreamData);
	if(version < 0x34000)
		size += 12;	// surface properties
	if(!(geo->flags & Geometry::NATIVE)){
		if(geo->flags&geo->PRELIT)
			size += 4*geo->numVertices;
		for(int32 i = 0; i < geo->numTexCoordSets; i++)
			size += 2*geo->numVertices*4;
		size += 4*geo->numTriangles*2;
	}
	for(int32 i = 0; i < geo->numMorphTargets; i++){
		MorphTarget *m = &geo->morphTargets[i];
		size += 4*4 + 2*4; // bounding sphere and bools
		if(!(geo->flags & Geometry::NATIVE)){
			if(m->vertices)
				size += 3*geo->numVertices*4;
			if(m->normals)
				size += 3*geo->numVertices*4;
		}
	}
	return size;
}